

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledFragmentAssembler.h
# Opt level: O2

ControlledPollAction __thiscall
aeron::ControlledFragmentAssembler::onFragment
          (ControlledFragmentAssembler *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  uint32_t limit;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  ControlledPollAction CVar6;
  int32_t iVar7;
  iterator iVar8;
  DataFrameHeaderDefn *pDVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>,_bool>
  pVar10;
  AtomicBuffer msgBuffer;
  Header local_60;
  
  bVar5 = concurrent::logbuffer::Header::flags(header);
  if (0xbf < bVar5) {
    CVar6 = std::
            function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
            ::operator()(&this->m_delegate,buffer,offset,length,header);
    return CVar6;
  }
  if ((char)bVar5 < '\0') {
    iVar7 = concurrent::logbuffer::Header::sessionId(header);
    local_60.m_context = (void *)CONCAT44(local_60.m_context._4_4_,iVar7);
    msgBuffer._vptr_AtomicBuffer._0_4_ = (undefined4)this->m_initialBufferLength;
    pVar10 = std::
             _Hashtable<int,std::pair<int_const,aeron::BufferBuilder>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<int,unsigned_int>
                       ((_Hashtable<int,std::pair<int_const,aeron::BufferBuilder>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->m_builderBySessionIdMap);
    *(undefined4 *)
     ((long)pVar10.first.
            super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur.
            super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false> + 0x1c) =
         0x20;
    BufferBuilder::append
              ((BufferBuilder *)
               ((long)pVar10.first.
                      super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
                      _M_cur.
                      super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false> +
               0x10),buffer,offset,length,header);
    CVar6 = CONTINUE;
  }
  else {
    iVar7 = concurrent::logbuffer::Header::sessionId(header);
    local_60.m_context = (void *)CONCAT44(local_60.m_context._4_4_,iVar7);
    iVar8 = std::
            _Hashtable<int,_std::pair<const_int,_aeron::BufferBuilder>,_std::allocator<std::pair<const_int,_aeron::BufferBuilder>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_builderBySessionIdMap)._M_h,(key_type *)&local_60);
    CVar6 = CONTINUE;
    if ((iVar8.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur
         != (__node_type *)0x0) &&
       (limit = *(uint32_t *)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                        ._M_cur + 0x1c), limit != 0x20)) {
      BufferBuilder::append
                ((BufferBuilder *)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                        ._M_cur + 0x10),buffer,offset,length,header);
      if (0x3f < bVar5) {
        uVar1 = *(uint *)((long)iVar8.
                                super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                ._M_cur + 0x1c);
        concurrent::AtomicBuffer::AtomicBuffer
                  (&msgBuffer,
                   *(uint8_t **)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                           ._M_cur + 0x20),(ulong)uVar1);
        local_60.m_context = header->m_context;
        local_60.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016e198;
        uVar4._0_4_ = header->m_offset;
        uVar4._4_4_ = header->m_initialTermId;
        local_60.m_positionBitsToShift = header->m_positionBitsToShift;
        local_60.m_buffer.m_buffer = msgBuffer.m_buffer;
        local_60.m_buffer.m_length = msgBuffer.m_length;
        local_60._32_8_ = uVar4 & 0xffffffff00000000;
        pDVar9 = concurrent::AtomicBuffer::
                 overlayStruct<aeron::concurrent::logbuffer::DataFrameHeader::DataFrameHeaderDefn>
                           (&msgBuffer);
        pDVar9->frameLength = uVar1;
        iVar7 = concurrent::logbuffer::Header::sessionId(header);
        pDVar9->sessionId = iVar7;
        iVar7 = concurrent::logbuffer::Header::streamId(header);
        pDVar9->streamId = iVar7;
        iVar7 = concurrent::logbuffer::Header::termId(header);
        pDVar9->termId = iVar7;
        pDVar9->flags = 0xc0;
        pDVar9->type = 1;
        iVar2 = header->m_offset;
        iVar3 = pDVar9->frameLength;
        iVar7 = concurrent::logbuffer::Header::frameLength(header);
        pDVar9->termOffset = iVar7 + (iVar2 - iVar3);
        CVar6 = std::
                function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
                ::operator()(&this->m_delegate,&msgBuffer,0x20,uVar1 - 0x20,&local_60);
        if (CVar6 == ABORT) {
          BufferBuilder::limit
                    ((BufferBuilder *)
                     ((long)iVar8.
                            super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                            ._M_cur + 0x10),limit);
        }
        else {
          *(undefined4 *)
           ((long)iVar8.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                  ._M_cur + 0x1c) = 0x20;
        }
      }
    }
  }
  return CVar6;
}

Assistant:

ControlledPollAction onFragment(AtomicBuffer& buffer, util::index_t offset, util::index_t length, Header& header)
    {
        const std::uint8_t flags = header.flags();
        ControlledPollAction action = ControlledPollAction::CONTINUE;

        if ((flags & FrameDescriptor::UNFRAGMENTED) == FrameDescriptor::UNFRAGMENTED)
        {
            action = m_delegate(buffer, offset, length, header);
        }
        else
        {
            if ((flags & FrameDescriptor::BEGIN_FRAG) == FrameDescriptor::BEGIN_FRAG)
            {
                auto result = m_builderBySessionIdMap.emplace(header.sessionId(), static_cast<std::uint32_t>(m_initialBufferLength));
                BufferBuilder& builder = result.first->second;

                builder
                    .reset()
                    .append(buffer, offset, length, header);
            }
            else
            {
                auto result = m_builderBySessionIdMap.find(header.sessionId());

                if (result != m_builderBySessionIdMap.end())
                {
                    BufferBuilder& builder = result->second;
                    const std::uint32_t limit = builder.limit();

                    if (builder.limit() != DataFrameHeader::LENGTH)
                    {
                        builder.append(buffer, offset, length, header);

                        if ((flags & FrameDescriptor::END_FRAG) == FrameDescriptor::END_FRAG)
                        {
                            const util::index_t msgLength = builder.limit() - DataFrameHeader::LENGTH;
                            AtomicBuffer msgBuffer(builder.buffer(), builder.limit());
                            Header assemblyHeader(header);

                            assemblyHeader.buffer(msgBuffer);
                            assemblyHeader.offset(0);
                            DataFrameHeader::DataFrameHeaderDefn& frame(
                                msgBuffer.overlayStruct<DataFrameHeader::DataFrameHeaderDefn>());

                            frame.frameLength = DataFrameHeader::LENGTH + msgLength;
                            frame.sessionId = header.sessionId();
                            frame.streamId = header.streamId();
                            frame.termId = header.termId();
                            frame.flags = FrameDescriptor::UNFRAGMENTED;
                            frame.type = DataFrameHeader::HDR_TYPE_DATA;
                            frame.termOffset = header.termOffset() - (frame.frameLength - header.frameLength());

                            action = m_delegate(msgBuffer, DataFrameHeader::LENGTH, msgLength, assemblyHeader);

                            if (ControlledPollAction::ABORT == action)
                            {
                                builder.limit(limit);
                            }
                            else
                            {
                                builder.reset();
                            }
                        }
                    }
                }
            }
        }

        return action;
    }